

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTest.cxx
# Opt level: O1

void __thiscall cmTest::cmTest(cmTest *this,cmMakefile *mf)

{
  (this->Properties).Map_._M_h._M_buckets = &(this->Properties).Map_._M_h._M_single_bucket;
  (this->Properties).Map_._M_h._M_bucket_count = 1;
  (this->Properties).Map_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->Properties).Map_._M_h._M_element_count = 0;
  (this->Properties).Map_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->Properties).Map_._M_h._M_rehash_policy._M_next_resize = 0;
  (this->Properties).Map_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->Name)._M_dataplus._M_p = (pointer)&(this->Name).field_2;
  (this->Name)._M_string_length = 0;
  (this->Name).field_2._M_local_buf[0] = '\0';
  (this->Command).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Command).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->Command).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1) = 0;
  *(undefined8 *)
   ((long)&(this->Command).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) = 0;
  cmMakefile::GetBacktrace(mf);
  this->Makefile = mf;
  this->OldStyle = true;
  return;
}

Assistant:

cmTest::cmTest(cmMakefile* mf)
  : Backtrace(mf->GetBacktrace())
{
  this->Makefile = mf;
  this->OldStyle = true;
}